

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O3

int MT32Emu::calcBasicAmp
              (Tables *tables,Partial *partial,System *system,PartialParam *partialParam,
              Bit8u partVolume,RhythmTemp *rhythmTemp,int biasAmpSubtraction,int veloAmpSubtraction,
              Bit8u expression,bool hasRingModQuirk)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  if (hasRingModQuirk) {
    bVar1 = Partial::isRingModulatingNoMix(partial);
  }
  else {
    bVar1 = Partial::isRingModulatingSlave(partial);
  }
  iVar2 = 0x9b;
  if ((((bVar1 == false) &&
       ((((0x9b < tables->masterVolToAmpSubtraction[system->masterVol] ||
          (uVar3 = (uint)tables->levelToAmpSubtraction[partVolume] +
                   (uint)tables->masterVolToAmpSubtraction[system->masterVol], 0x9b < uVar3)) ||
         (uVar3 = uVar3 + tables->levelToAmpSubtraction[expression], iVar2 = 0x9b - uVar3,
         0x9b < uVar3)) ||
        ((rhythmTemp != (RhythmTemp *)0x0 &&
         (iVar2 = iVar2 - (uint)tables->levelToAmpSubtraction[rhythmTemp->outputLevel], iVar2 < 0)))
        ))) || (iVar2 - biasAmpSubtraction < 0)) ||
     ((iVar2 = (iVar2 - biasAmpSubtraction) -
               (uint)tables->levelToAmpSubtraction[(partialParam->tva).level], iVar2 < 0 ||
      (uVar3 = iVar2 - veloAmpSubtraction, (int)uVar3 < 0)))) {
    iVar2 = 0;
  }
  else {
    uVar4 = 0x9b;
    if (uVar3 < 0x9b) {
      uVar4 = uVar3;
    }
    iVar5 = uVar4 - ((partialParam->tvf).resonance >> 1);
    iVar2 = 0;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
  }
  return iVar2;
}

Assistant:

static int calcBasicAmp(const Tables *tables, const Partial *partial, const MemParams::System *system, const TimbreParam::PartialParam *partialParam, Bit8u partVolume, const MemParams::RhythmTemp *rhythmTemp, int biasAmpSubtraction, int veloAmpSubtraction, Bit8u expression, bool hasRingModQuirk) {
	int amp = 155;

	if (!(hasRingModQuirk ? partial->isRingModulatingNoMix() : partial->isRingModulatingSlave())) {
		amp -= tables->masterVolToAmpSubtraction[system->masterVol];
		if (amp < 0) {
			return 0;
		}
		amp -= tables->levelToAmpSubtraction[partVolume];
		if (amp < 0) {
			return 0;
		}
		amp -= tables->levelToAmpSubtraction[expression];
		if (amp < 0) {
			return 0;
		}
		if (rhythmTemp != NULL) {
			amp -= tables->levelToAmpSubtraction[rhythmTemp->outputLevel];
			if (amp < 0) {
				return 0;
			}
		}
	}
	amp -= biasAmpSubtraction;
	if (amp < 0) {
		return 0;
	}
	amp -= tables->levelToAmpSubtraction[partialParam->tva.level];
	if (amp < 0) {
		return 0;
	}
	amp -= veloAmpSubtraction;
	if (amp < 0) {
		return 0;
	}
	if (amp > 155) {
		amp = 155;
	}
	amp -= partialParam->tvf.resonance >> 1;
	if (amp < 0) {
		return 0;
	}
	return amp;
}